

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void canvas_dodsp(_glist *x,int toplevel,t_signal **sp)

{
  undefined8 sp_00;
  int iVar1;
  int noutlets;
  t_symbol *s;
  _dspcontext *dc_00;
  t_object *obj;
  t_gotfn p_Var2;
  _outconnect *p_Var3;
  _dspcontext *dc;
  t_symbol *dspsym;
  t_object *ob;
  t_gobj *y;
  _outconnect *oc;
  t_linetraverser t;
  t_signal **sp_local;
  int toplevel_local;
  _glist *x_local;
  
  t._112_8_ = sp;
  s = gensym("dsp");
  sp_00 = t._112_8_;
  iVar1 = obj_nsiginlets(&x->gl_obj);
  noutlets = obj_nsigoutlets(&x->gl_obj);
  dc_00 = ugen_start_graph(toplevel,(t_signal **)sp_00,iVar1,noutlets);
  for (ob = (t_object *)x->gl_list; ob != (t_object *)0x0; ob = (t_object *)(ob->te_g).g_next) {
    obj = pd_checkobject((t_pd *)ob);
    if ((obj != (t_object *)0x0) && (p_Var2 = zgetfn((t_pd *)ob,s), p_Var2 != (t_gotfn)0x0)) {
      ugen_add(dc_00,obj);
    }
  }
  linetraverser_start((t_linetraverser *)&oc,x);
  while (p_Var3 = linetraverser_next((t_linetraverser *)&oc), p_Var3 != (_outconnect *)0x0) {
    iVar1 = obj_issignaloutlet(&(t.tr_x)->gl_obj,t.tr_ob._4_4_);
    if (iVar1 != 0) {
      ugen_connect(dc_00,&(t.tr_x)->gl_obj,t.tr_ob._4_4_,(t_object *)t._16_8_,t.tr_inlet._4_4_);
    }
  }
  ugen_done_graph(dc_00);
  return;
}

Assistant:

void canvas_dodsp(t_canvas *x, int toplevel, t_signal **sp)
{
    t_linetraverser t;
    t_outconnect *oc;
    t_gobj *y;
    t_object *ob;
    t_symbol *dspsym = gensym("dsp");
    t_dspcontext *dc;

        /* create a new "DSP graph" object to use in sorting this canvas.
        If we aren't toplevel, there are already other dspcontexts around. */

    dc = ugen_start_graph(toplevel, sp,
        obj_nsiginlets(&x->gl_obj),
        obj_nsigoutlets(&x->gl_obj));

        /* find all the "dsp" boxes and add them to the graph */

    for (y = x->gl_list; y; y = y->g_next)
        if ((ob = pd_checkobject(&y->g_pd)) && zgetfn(&y->g_pd, dspsym))
            ugen_add(dc, ob);

        /* ... and all dsp interconnections */
    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
        if (obj_issignaloutlet(t.tr_ob, t.tr_outno))
            ugen_connect(dc, t.tr_ob, t.tr_outno, t.tr_ob2, t.tr_inno);

        /* finally, sort them and add them to the DSP chain */
    ugen_done_graph(dc);
}